

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS
ref_cavity_form_edge_collapse(REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1)

{
  int iVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_ADJ pRVar4;
  REF_ADJ_ITEM pRVar5;
  REF_INT *pRVar6;
  REF_DBL *pRVar7;
  uint uVar8;
  REF_STATUS RVar9;
  REF_INT *pRVar10;
  long lVar11;
  int iVar12;
  undefined8 uVar13;
  REF_INT RVar14;
  long lVar15;
  REF_LIST pRVar16;
  long lVar17;
  bool bVar18;
  char *pcVar19;
  bool bVar20;
  long lVar21;
  REF_CELL pRVar22;
  bool bVar23;
  bool bVar24;
  REF_BOOL already_have_it;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  int local_84;
  REF_CELL local_80;
  long local_78;
  int local_6c;
  int local_68;
  REF_INT local_64;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  REF_INT local_3c [3];
  
  pRVar3 = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = node0;
  iVar12 = pRVar3->ref_mpi->id;
  if ((iVar12 == pRVar3->part[node0]) && (local_48 = (long)node1, iVar12 == pRVar3->part[local_48]))
  {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      ref_cavity->collapse_node0 = node0;
      ref_cavity->collapse_node1 = node1;
      pRVar22 = ref_grid->cell[8];
      local_80 = pRVar22;
      if (((node0 < 0) || (pRVar4 = pRVar22->ref_adj, pRVar4->nnode <= node0)) ||
         (lVar11 = (long)pRVar4->first[node0], lVar11 == -1)) {
LAB_0019a359:
        if (((node1 < 0) || (pRVar4 = pRVar22->ref_adj, pRVar4->nnode <= node1)) ||
           (lVar11 = (long)pRVar4->first[local_48], lVar11 == -1)) {
LAB_0019a535:
          local_80 = ref_grid->cell[3];
          if (((node0 < 0) || (pRVar4 = local_80->ref_adj, pRVar4->nnode <= node0)) ||
             (lVar11 = (long)pRVar4->first[node0], lVar11 == -1)) {
LAB_0019a768:
            if (((node1 < 0) || (pRVar4 = local_80->ref_adj, pRVar4->nnode <= node1)) ||
               (lVar11 = (long)pRVar4->first[local_48], lVar11 == -1)) {
LAB_0019a9a8:
              RVar9 = ref_cavity_verify_face_manifold(ref_cavity);
              if (RVar9 == 0) {
                RVar9 = ref_cavity_verify_seg_manifold(ref_cavity);
                if (RVar9 == 0) {
                  return 0;
                }
                pcVar19 = "collapse seg manifold";
                uVar13 = 0x691;
              }
              else {
                pcVar19 = "collapse face manifold";
                uVar13 = 0x68b;
              }
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,uVar13,"ref_cavity_form_edge_collapse",1,pcVar19);
              pRVar7 = pRVar3->real;
              lVar11 = (long)ref_cavity->node;
              printf("at %f %f %f\n",pRVar7[lVar11 * 0xf],pRVar7[lVar11 * 0xf + 1],
                     pRVar7[lVar11 * 0xf + 2]);
              return 1;
            }
            RVar14 = pRVar4->item[lVar11].ref;
            pRVar16 = ref_cavity->tri_list;
            while (uVar8 = ref_list_contains(pRVar16,RVar14,&local_84), uVar8 == 0) {
              if (local_84 == 0) {
                uVar8 = ref_list_push(ref_cavity->tri_list,RVar14);
                if (uVar8 != 0) {
                  pcVar19 = "save tri";
                  uVar13 = 0x662;
                  goto LAB_0019aae3;
                }
                if (0 < (long)local_80->node_per) {
                  iVar12 = local_80->size_per * RVar14;
                  pRVar10 = local_80->c2n;
                  lVar17 = 0;
                  bVar20 = false;
                  bVar18 = false;
                  do {
                    bVar24 = true;
                    bVar23 = true;
                    if (!bVar18) {
                      bVar23 = pRVar10[iVar12 + lVar17] == node0;
                    }
                    if (!bVar20) {
                      bVar24 = pRVar10[iVar12 + lVar17] == node1;
                    }
                    if (pRVar3->ref_mpi->id != pRVar3->part[pRVar10[iVar12 + lVar17]])
                    goto LAB_0019a98d;
                    lVar17 = lVar17 + 1;
                    bVar20 = bVar24;
                    bVar18 = bVar23;
                  } while (local_80->node_per != lVar17);
                  if ((bool)(bVar23 & bVar24)) goto LAB_0019a7be;
                }
                pRVar10 = local_80->c2n;
                lVar21 = (long)RVar14;
                lVar17 = local_80->size_per * lVar21;
                if ((pRVar10[lVar17] != node1) && (pRVar10[lVar17 + 1] != node1)) {
                  local_64 = pRVar10[lVar17 + 3];
                  local_6c = pRVar10[lVar17];
                  local_68 = pRVar10[lVar17 + 1];
                  uVar8 = ref_cavity_insert_seg(ref_cavity,&local_6c);
                  if (uVar8 != 0) {
                    pcVar19 = "tri 1 side 01";
                    uVar13 = 0x674;
                    goto LAB_0019aae3;
                  }
                  pRVar10 = local_80->c2n;
                  lVar17 = local_80->size_per * lVar21;
                }
                if ((pRVar10[lVar17 + 1] != node1) && (pRVar10[lVar17 + 2] != node1)) {
                  local_64 = pRVar10[lVar17 + 3];
                  local_6c = pRVar10[lVar17 + 1];
                  local_68 = pRVar10[lVar17 + 2];
                  uVar8 = ref_cavity_insert_seg(ref_cavity,&local_6c);
                  if (uVar8 != 0) {
                    pcVar19 = "tri 1 side 12";
                    uVar13 = 0x67b;
                    goto LAB_0019aae3;
                  }
                  pRVar10 = local_80->c2n;
                  lVar17 = local_80->size_per * lVar21;
                }
                if ((pRVar10[lVar17 + 2] != node1) && (pRVar10[lVar17] != node1)) {
                  local_64 = pRVar10[lVar17 + 3];
                  local_6c = pRVar10[lVar17 + 2];
                  local_68 = pRVar10[lVar17];
                  uVar8 = ref_cavity_insert_seg(ref_cavity,&local_6c);
                  if (uVar8 != 0) {
                    pcVar19 = "tri 1 side 20";
                    uVar13 = 0x682;
                    goto LAB_0019aae3;
                  }
                }
              }
LAB_0019a7be:
              pRVar5 = local_80->ref_adj->item;
              lVar11 = (long)pRVar5[(int)lVar11].next;
              if (lVar11 == -1) goto LAB_0019a9a8;
              RVar14 = pRVar5[lVar11].ref;
              pRVar16 = ref_cavity->tri_list;
            }
            pcVar19 = "have tet?";
            uVar13 = 0x660;
          }
          else {
            RVar14 = pRVar4->item[lVar11].ref;
            pRVar16 = ref_cavity->tri_list;
            while (uVar8 = ref_list_contains(pRVar16,RVar14,&local_84), uVar8 == 0) {
              if (local_84 == 0) {
                uVar8 = ref_list_push(ref_cavity->tri_list,RVar14);
                if (uVar8 != 0) {
                  pcVar19 = "save tri";
                  uVar13 = 0x639;
                  goto LAB_0019aae3;
                }
                if (0 < (long)local_80->node_per) {
                  iVar12 = local_80->size_per * RVar14;
                  pRVar10 = local_80->c2n;
                  lVar17 = 0;
                  bVar20 = false;
                  bVar18 = false;
                  do {
                    bVar24 = true;
                    bVar23 = true;
                    if (!bVar18) {
                      bVar23 = pRVar10[iVar12 + lVar17] == node0;
                    }
                    if (!bVar20) {
                      bVar24 = pRVar10[iVar12 + lVar17] == node1;
                    }
                    if (pRVar3->ref_mpi->id != pRVar3->part[pRVar10[iVar12 + lVar17]])
                    goto LAB_0019a98d;
                    lVar17 = lVar17 + 1;
                    bVar20 = bVar24;
                    bVar18 = bVar23;
                  } while (local_80->node_per != lVar17);
                  if ((bool)(bVar23 & bVar24)) goto LAB_0019a595;
                }
                pRVar10 = local_80->c2n;
                lVar21 = (long)RVar14;
                lVar17 = local_80->size_per * lVar21;
                if ((pRVar10[lVar17] != node0) && (pRVar10[lVar17 + 1] != node0)) {
                  local_64 = pRVar10[lVar17 + 3];
                  local_6c = pRVar10[lVar17];
                  local_68 = pRVar10[lVar17 + 1];
                  uVar8 = ref_cavity_insert_seg(ref_cavity,&local_6c);
                  if (uVar8 != 0) {
                    pcVar19 = "tri 0 side 01";
                    uVar13 = 0x64b;
                    goto LAB_0019aae3;
                  }
                  pRVar10 = local_80->c2n;
                  lVar17 = local_80->size_per * lVar21;
                }
                if ((pRVar10[lVar17 + 1] != node0) && (pRVar10[lVar17 + 2] != node0)) {
                  local_64 = pRVar10[lVar17 + 3];
                  local_6c = pRVar10[lVar17 + 1];
                  local_68 = pRVar10[lVar17 + 2];
                  uVar8 = ref_cavity_insert_seg(ref_cavity,&local_6c);
                  if (uVar8 != 0) {
                    pcVar19 = "tri 0 side 12";
                    uVar13 = 0x652;
                    goto LAB_0019aae3;
                  }
                  pRVar10 = local_80->c2n;
                  lVar17 = local_80->size_per * lVar21;
                }
                if ((pRVar10[lVar17 + 2] != node0) && (pRVar10[lVar17] != node0)) {
                  local_64 = pRVar10[lVar17 + 3];
                  local_6c = pRVar10[lVar17 + 2];
                  local_68 = pRVar10[lVar17];
                  uVar8 = ref_cavity_insert_seg(ref_cavity,&local_6c);
                  if (uVar8 != 0) {
                    pcVar19 = "tri 0 side 20";
                    uVar13 = 0x659;
                    goto LAB_0019aae3;
                  }
                }
              }
LAB_0019a595:
              pRVar5 = local_80->ref_adj->item;
              lVar11 = (long)pRVar5[(int)lVar11].next;
              if (lVar11 == -1) goto LAB_0019a768;
              RVar14 = pRVar5[lVar11].ref;
              pRVar16 = ref_cavity->tri_list;
            }
            pcVar19 = "have tet?";
            uVar13 = 0x637;
          }
        }
        else {
          RVar14 = pRVar4->item[lVar11].ref;
          pRVar16 = ref_cavity->tet_list;
          local_78 = CONCAT44(local_78._4_4_,RVar14);
          local_60 = lVar11;
          while (uVar8 = ref_list_contains(pRVar16,RVar14,&local_84), uVar8 == 0) {
            pRVar22 = local_80;
            if (local_84 == 0) {
              uVar8 = ref_list_push(ref_cavity->tet_list,(REF_INT)local_78);
              if (uVar8 != 0) {
                pcVar19 = "save tet";
                uVar13 = 0x61a;
                goto LAB_0019aae3;
              }
              pRVar22 = local_80;
              if (0 < (long)local_80->node_per) {
                iVar12 = local_80->size_per * (REF_INT)local_78;
                pRVar10 = local_80->c2n;
                lVar11 = 0;
                bVar20 = false;
                bVar18 = false;
                do {
                  bVar24 = true;
                  bVar23 = true;
                  if (!bVar18) {
                    bVar23 = pRVar10[iVar12 + lVar11] == node0;
                  }
                  if (!bVar20) {
                    bVar24 = pRVar10[iVar12 + lVar11] == node1;
                  }
                  if (pRVar3->ref_mpi->id != pRVar3->part[pRVar10[iVar12 + lVar11]])
                  goto LAB_0019a98d;
                  lVar11 = lVar11 + 1;
                  bVar20 = bVar24;
                  bVar18 = bVar23;
                } while (local_80->node_per != lVar11);
                if ((bool)(bVar23 & bVar24)) goto LAB_0019a3b8;
              }
              iVar12 = local_80->face_per;
              if (0 < iVar12) {
                lVar11 = (long)(REF_INT)local_78;
                lVar21 = 0;
                lVar17 = 0;
                local_58 = lVar11;
                do {
                  pRVar10 = pRVar22->c2n;
                  iVar1 = pRVar22->size_per;
                  pRVar6 = pRVar22->f2n;
                  lVar15 = 0;
                  bVar20 = false;
                  do {
                    bVar18 = bVar20;
                    iVar2 = pRVar10[(long)*(int *)((long)pRVar6 + lVar15 * 4 + lVar21) +
                                    iVar1 * lVar11];
                    local_3c[lVar15] = iVar2;
                    lVar15 = lVar15 + 1;
                    bVar20 = (bool)(bVar18 | iVar2 == node1);
                  } while (lVar15 != 3);
                  local_78 = lVar17;
                  local_50 = lVar21;
                  if (!bVar18 && iVar2 != node1) {
                    uVar8 = ref_cavity_insert_face(ref_cavity,local_3c);
                    if (uVar8 != 0) {
                      pcVar19 = "tet face";
                      uVar13 = 0x62e;
                      goto LAB_0019aae3;
                    }
                    iVar12 = local_80->face_per;
                    lVar11 = local_58;
                    pRVar22 = local_80;
                  }
                  lVar17 = local_78 + 1;
                  lVar21 = local_50 + 0x10;
                } while (lVar17 < iVar12);
              }
            }
LAB_0019a3b8:
            pRVar5 = pRVar22->ref_adj->item;
            lVar11 = (long)pRVar5[(int)local_60].next;
            if (lVar11 == -1) goto LAB_0019a535;
            RVar14 = pRVar5[lVar11].ref;
            pRVar16 = ref_cavity->tet_list;
            local_78 = CONCAT44(local_78._4_4_,RVar14);
            local_60 = lVar11;
          }
          pcVar19 = "have tet?";
          uVar13 = 0x618;
        }
      }
      else {
        RVar14 = pRVar4->item[lVar11].ref;
        pRVar16 = ref_cavity->tet_list;
        local_78 = CONCAT44(local_78._4_4_,RVar14);
        local_60 = lVar11;
        while (uVar8 = ref_list_contains(pRVar16,RVar14,&local_84), uVar8 == 0) {
          pRVar22 = local_80;
          if (local_84 == 0) {
            uVar8 = ref_list_push(ref_cavity->tet_list,(REF_INT)local_78);
            if (uVar8 != 0) {
              pcVar19 = "save tet";
              uVar13 = 0x5fd;
              goto LAB_0019aae3;
            }
            pRVar22 = local_80;
            if (0 < (long)local_80->node_per) {
              iVar12 = local_80->size_per * (REF_INT)local_78;
              pRVar10 = local_80->c2n;
              lVar11 = 0;
              bVar20 = false;
              bVar18 = false;
              do {
                bVar24 = true;
                bVar23 = true;
                if (!bVar18) {
                  bVar23 = pRVar10[iVar12 + lVar11] == node0;
                }
                if (!bVar20) {
                  bVar24 = pRVar10[iVar12 + lVar11] == node1;
                }
                if (pRVar3->ref_mpi->id != pRVar3->part[pRVar10[iVar12 + lVar11]])
                goto LAB_0019a98d;
                lVar11 = lVar11 + 1;
                bVar20 = bVar24;
                bVar18 = bVar23;
              } while (local_80->node_per != lVar11);
              if ((bool)(bVar23 & bVar24)) goto LAB_0019a1dc;
            }
            iVar12 = local_80->face_per;
            if (0 < iVar12) {
              lVar11 = (long)(REF_INT)local_78;
              lVar21 = 0;
              lVar17 = 0;
              local_58 = lVar11;
              do {
                pRVar10 = pRVar22->c2n;
                iVar1 = pRVar22->size_per;
                pRVar6 = pRVar22->f2n;
                lVar15 = 0;
                bVar20 = false;
                do {
                  bVar18 = bVar20;
                  iVar2 = pRVar10[(long)*(int *)((long)pRVar6 + lVar15 * 4 + lVar21) +
                                  iVar1 * lVar11];
                  local_3c[lVar15] = iVar2;
                  lVar15 = lVar15 + 1;
                  bVar20 = (bool)(bVar18 | iVar2 == node0);
                } while (lVar15 != 3);
                local_78 = lVar17;
                local_50 = lVar21;
                if (!bVar18 && iVar2 != node0) {
                  uVar8 = ref_cavity_insert_face(ref_cavity,local_3c);
                  if (uVar8 != 0) {
                    pcVar19 = "tet face";
                    uVar13 = 0x611;
                    goto LAB_0019aae3;
                  }
                  iVar12 = local_80->face_per;
                  lVar11 = local_58;
                  pRVar22 = local_80;
                }
                lVar17 = local_78 + 1;
                lVar21 = local_50 + 0x10;
              } while (lVar17 < iVar12);
            }
          }
LAB_0019a1dc:
          pRVar5 = pRVar22->ref_adj->item;
          lVar11 = (long)pRVar5[(int)local_60].next;
          if (lVar11 == -1) goto LAB_0019a359;
          RVar14 = pRVar5[lVar11].ref;
          pRVar16 = ref_cavity->tet_list;
          local_78 = CONCAT44(local_78._4_4_,RVar14);
          local_60 = lVar11;
        }
        pcVar19 = "have tet?";
        uVar13 = 0x5fb;
      }
LAB_0019aae3:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar13,"ref_cavity_form_edge_collapse",(ulong)uVar8,pcVar19);
      return uVar8;
    }
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
  }
  else {
LAB_0019a98d:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_collapse(REF_CAVITY ref_cavity,
                                                 REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell;

  REF_INT cell_face;
  REF_INT node, face_nodes[3], seg_nodes[3];
  REF_BOOL will_be_collapsed, already_have_it;
  REF_BOOL has_node0, has_node1;

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node0), "init form empty");
  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity->collapse_node0 = node0;
  ref_cavity->collapse_node1 = node1;

  ref_cell = ref_grid_tet(ref_grid);

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    each_ref_cell_cell_face(ref_cell, cell_face) {
      has_node0 = REF_FALSE;
      each_ref_cavity_face_node(ref_cavity, node) {
        face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        has_node0 = has_node0 || (node0 == face_nodes[node]);
      }
      if (!has_node0)
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet face");
    }
  }

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    each_ref_cell_cell_face(ref_cell, cell_face) {
      has_node1 = REF_FALSE;
      each_ref_cavity_face_node(ref_cavity, node) {
        face_nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        has_node1 = has_node1 || (node1 == face_nodes[node]);
      }
      if (!has_node1)
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet face");
    }
  }

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    if (node0 != ref_cell_c2n(ref_cell, 0, cell) &&
        node0 != ref_cell_c2n(ref_cell, 1, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 01");
    }
    if (node0 != ref_cell_c2n(ref_cell, 1, cell) &&
        node0 != ref_cell_c2n(ref_cell, 2, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 12");
    }
    if (node0 != ref_cell_c2n(ref_cell, 2, cell) &&
        node0 != ref_cell_c2n(ref_cell, 0, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 0 side 20");
    }
  }

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    if (already_have_it) continue;
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    has_node0 = REF_FALSE;
    has_node1 = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, node) {
      has_node0 = has_node0 || (node0 == ref_cell_c2n(ref_cell, node, cell));
      has_node1 = has_node1 || (node1 == ref_cell_c2n(ref_cell, node, cell));
      if (!ref_node_owned(ref_node, ref_cell_c2n(ref_cell, node, cell))) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
    }
    will_be_collapsed = has_node0 && has_node1;
    if (will_be_collapsed) continue;
    if (node1 != ref_cell_c2n(ref_cell, 0, cell) &&
        node1 != ref_cell_c2n(ref_cell, 1, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 01");
    }
    if (node1 != ref_cell_c2n(ref_cell, 1, cell) &&
        node1 != ref_cell_c2n(ref_cell, 2, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 12");
    }
    if (node1 != ref_cell_c2n(ref_cell, 2, cell) &&
        node1 != ref_cell_c2n(ref_cell, 0, cell)) {
      seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
      seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
      seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri 1 side 20");
    }
  }

  RSB(ref_cavity_verify_face_manifold(ref_cavity), "collapse face manifold", {
    printf("at %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });
  RSB(ref_cavity_verify_seg_manifold(ref_cavity), "collapse seg manifold", {
    printf("at %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });

  return REF_SUCCESS;
}